

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O2

void write_symlist(wchar_t fd,curses_symdef_conflict *list,wchar_t len)

{
  size_t __n;
  ulong uVar1;
  long lVar2;
  char buf [256];
  char acStack_138 [264];
  
  uVar1 = (ulong)(uint)len;
  if (len < L'\x01') {
    uVar1 = 0;
  }
  for (lVar2 = 0; uVar1 * 0x28 - lVar2 != 0; lVar2 = lVar2 + 0x28) {
    sprintf(acStack_138,"%c\"%s\"\t%d\t%04x\n",
            (ulong)((uint)(*(char *)((long)list->unichar + lVar2 + 0x1a) == '\0') * 2 + 0x21),
            *(undefined8 *)((long)list->unichar + lVar2 + -0xc),
            (ulong)*(uint *)((long)list->unichar + lVar2 + -4),
            (ulong)*(uint *)((long)list->unichar + lVar2));
    __n = strlen(acStack_138);
    write(fd,acStack_138,__n);
  }
  return;
}

Assistant:

static void write_symlist(int fd, const struct curses_symdef *list, int len)
{
    char buf[BUFSZ];
    int i;
    
    for (i = 0; i < len; i++) {
	sprintf(buf, "%c\"%s\"\t%d\t%04x\n", list[i].custom ? '!' : '#',
		list[i].symname, list[i].color, list[i].unichar[0]);
	write(fd, buf, strlen(buf));
    }
}